

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O1

bool __thiscall
Js::AsmJsImportFunction::SupportsArgCall
          (AsmJsImportFunction *this,ArgSlot argCount,AsmJsType *args,AsmJsRetType *retType)

{
  Which WVar1;
  undefined6 in_register_00000032;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  
  bVar3 = (int)CONCAT62(in_register_00000032,argCount) == 0;
  if (!bVar3) {
    uVar2 = 1;
    do {
      WVar1 = args[uVar2 - 1].which_;
      if (((WVar1 != Double) && (WVar1 != DoubleLit)) && (1 < WVar1 - Fixnum)) {
        return bVar3;
      }
      bVar3 = argCount <= uVar2;
      bVar4 = uVar2 != argCount;
      uVar2 = uVar2 + 1;
    } while (bVar4);
  }
  return bVar3;
}

Assistant:

bool AsmJsImportFunction::SupportsArgCall(ArgSlot argCount, AsmJsType* args, AsmJsRetType& retType )
    {
        for (ArgSlot i = 0; i < argCount ; i++)
        {
            if (!args[i].isExtern())
            {
                return false;
            }
        }
        return true;
    }